

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall
icu_63::VTimeZone::writeZonePropsByDOM
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,int32_t month,int32_t dayOfMonth,UDate startTime,UDate untilTime,
          UErrorCode *status)

{
  UBool UVar1;
  UnicodeString *until;
  UErrorCode *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_02;
  undefined1 local_80 [8];
  UnicodeString dstr;
  UDate untilTime_local;
  UDate startTime_local;
  int32_t toOffset_local;
  int32_t fromOffset_local;
  UnicodeString *zonename_local;
  UBool isDst_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  dstr.fUnion._48_8_ = untilTime;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  beginZoneProps(this,writer,isDst,zonename,fromOffset,toOffset,startTime,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  __n = status;
  beginRRULE(this,writer,month,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  VTZWriter::write(writer,0x3de250,__buf,(size_t)__n);
  VTZWriter::write(writer,0x3d,__buf_00,(size_t)__n);
  UnicodeString::UnicodeString((UnicodeString *)local_80);
  appendAsciiDigits(dayOfMonth,'\0',(UnicodeString *)local_80);
  VTZWriter::write(writer,(int)local_80,__buf_01,(size_t)__n);
  if (((double)dstr.fUnion._48_8_ != 1.838821689216e+17) ||
     (__buf_02 = extraout_RDX, NAN((double)dstr.fUnion._48_8_))) {
    until = getDateTimeString((double)dstr.fUnion._48_8_ + (double)fromOffset,
                              (UnicodeString *)local_80);
    __n = status;
    appendUNTIL(this,writer,until,status);
    UVar1 = ::U_FAILURE(*status);
    __buf_02 = extraout_RDX_00;
    if (UVar1 != '\0') goto LAB_0024a465;
  }
  VTZWriter::write(writer,0x3de1de,__buf_02,(size_t)__n);
  endZoneProps(this,writer,isDst,status);
LAB_0024a465:
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return;
}

Assistant:

void
VTimeZone::writeZonePropsByDOM(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                               int32_t fromOffset, int32_t toOffset,
                               int32_t month, int32_t dayOfMonth, UDate startTime, UDate untilTime,
                               UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    beginZoneProps(writer, isDst, zonename, fromOffset, toOffset, startTime, status);
    if (U_FAILURE(status)) {
        return;
    }
    beginRRULE(writer, month, status);
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BYMONTHDAY);
    writer.write(EQUALS_SIGN);
    UnicodeString dstr;
    appendAsciiDigits(dayOfMonth, 0, dstr);
    writer.write(dstr);
    if (untilTime != MAX_MILLIS) {
        appendUNTIL(writer, getDateTimeString(untilTime + fromOffset, dstr), status);
        if (U_FAILURE(status)) {
            return;
        }
    }
    writer.write(ICAL_NEWLINE);
    endZoneProps(writer, isDst, status);
}